

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

bool COST_SENSITIVE::test_label(void *v)

{
  size_t sVar1;
  wclass *pwVar2;
  v_array<COST_SENSITIVE::wclass> *in_RDI;
  uint i;
  label *ld;
  uint local_1c;
  
  sVar1 = v_array<COST_SENSITIVE::wclass>::size(in_RDI);
  if (sVar1 != 0) {
    for (local_1c = 0; sVar1 = v_array<COST_SENSITIVE::wclass>::size(in_RDI), local_1c < sVar1;
        local_1c = local_1c + 1) {
      pwVar2 = v_array<COST_SENSITIVE::wclass>::operator[](in_RDI,(ulong)local_1c);
      if ((pwVar2->x != 3.4028235e+38) || (NAN(pwVar2->x))) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool test_label(void* v)
{
  label* ld = (label*)v;
  if (ld->costs.size() == 0)
    return true;
  for (unsigned int i = 0; i < ld->costs.size(); i++)
    if (FLT_MAX != ld->costs[i].x)
      return false;
  return true;
}